

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O1

void __thiscall Rml::DataParser::SkipWhitespace(DataParser *this)

{
  pointer pcVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->reached_end == false) {
    uVar5 = (ulong)(byte)(this->expression)._M_dataplus._M_p[this->index];
  }
  else {
    uVar5 = 0;
  }
  bVar3 = this->reached_end;
  pcVar1 = (this->expression)._M_dataplus._M_p;
  uVar2 = (this->expression)._M_string_length;
  uVar4 = this->index;
  while ((uVar4 = uVar4 + 1, (byte)uVar5 < 0x21 && ((0x100002600U >> (uVar5 & 0x3f) & 1) != 0))) {
    this->index = uVar4;
    if (uVar2 <= uVar4) {
      this->reached_end = true;
      bVar3 = 1;
    }
    if ((bVar3 & 1) == 0) {
      uVar5 = (ulong)(byte)pcVar1[uVar4];
    }
    else {
      uVar5 = 0;
    }
  }
  return;
}

Assistant:

char Look()
	{
		if (reached_end)
			return '\0';
		return expression[index];
	}